

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleDictionaryEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation> * __thiscall
Memory::
AllocateArray<Memory::HeapAllocator,JsUtil::SimpleDictionaryEntry<unsigned_long,TTD::TopLevelFunctionInContextRelation>,false>
          (Memory *this,HeapAllocator *allocator,offset_in_HeapAllocator_to_subr AllocFunc,
          size_t count)

{
  SimpleDictionaryEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation> *pSVar1;
  
  pSVar1 = (SimpleDictionaryEntry<unsigned_long,_TTD::TopLevelFunctionInContextRelation> *)
           new__<Memory::HeapAllocator>
                     (-(ulong)(count >> 0x3b != 0) | count << 5,(HeapAllocator *)this,
                      (offset_in_HeapAllocator_to_subr)allocator);
  return pSVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}